

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void SSTable::readDic(string *fileName,SSTableDic *dic)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *this;
  uint64_t i;
  ulong uVar4;
  long lVar5;
  allocator local_2b5;
  int offset;
  uint64_t length;
  vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
  *local_2a8;
  uint64_t key;
  vector<unsigned_long,_std::allocator<unsigned_long>_> keys;
  vector<int,_std::allocator<int>_> offsets;
  string value;
  ifstream in;
  byte abStack_218 [488];
  
  local_2a8 = (vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
               *)dic;
  std::ifstream::ifstream(&in,(string *)fileName,_S_in|_S_bin);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) == 0) {
    std::istream::seekg((long)&in,8);
    read64(&in,&length);
    std::istream::seekg((long)&in,0x2820);
    keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (uVar4 = 0; uVar4 < length; uVar4 = uVar4 + 1) {
      read64(&in,&key);
      read32(&in,&offset);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&keys,&key);
      std::vector<int,_std::allocator<int>_>::push_back(&offsets,&offset);
    }
    read64(&in,&key);
    read32(&in,&offset);
    std::vector<int,_std::allocator<int>_>::push_back(&offsets,&offset);
    lVar5 = 0;
    for (uVar4 = 0; uVar4 < length; uVar4 = uVar4 + 1) {
      iVar1 = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4 + 1];
      iVar2 = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4];
      pcVar3 = (char *)operator_new__(((long)iVar1 - (long)iVar2) + 1);
      std::istream::read((char *)&in,(long)pcVar3);
      pcVar3[(long)iVar1 - (long)iVar2] = '\0';
      std::__cxx11::string::string((string *)&value,pcVar3,&local_2b5);
      operator_delete__(pcVar3);
      std::
      vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
      ::emplace_back<unsigned_long&,std::__cxx11::string&>
                (local_2a8,
                 (unsigned_long *)
                 ((long)keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar5),&value);
      std::__cxx11::string::~string((string *)&value);
      lVar5 = lVar5 + 8;
    }
    std::ifstream::close();
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&offsets.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::ifstream::~ifstream(&in);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 "readDic: Open file ",fileName);
  std::operator+(&value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 " failed!");
  std::runtime_error::runtime_error(this,(string *)&value);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::readDic(const string &fileName, SSTableDic &dic) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  uint64_t length;
  in.seekg(8, ifstream::beg);  // skip timeStamp
  read64(in, length);
  in.seekg(10272, ifstream::beg);  // skip header and bloomFilter

  // read keys and offsets
  vector<uint64_t> keys;
  vector<int> offsets;
  uint64_t key;
  int offset;
  for (uint64_t i = 0; i < length; i++) {
    read64(in, key);
    read32(in, offset);
    keys.push_back(key);
    offsets.push_back(offset);
  }
  read64(in, key);
  read32(in, offset);
  offsets.push_back(offset);

  // read values
  for (uint64_t i = 0; i < length; i++) {
    auto valueSize = offsets[i + 1] - offsets[i];
    char *buf = new char[valueSize + 1];
    in.read(buf, valueSize);
    buf[valueSize] = '\0';
    string value(buf);
    delete[] buf;
    dic.emplace_back(keys[i], value);
  }

  in.close();
}